

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

bool __thiscall
Js::VariableWalkerBase::IsPropertyValid
          (VariableWalkerBase *this,PropertyId propertyId,RegSlot location,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ScopeObjectChain *pSVar6;
  DiagStackFrame *pDVar7;
  
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x1db,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar2) goto LAB_008ae1a5;
    *puVar5 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x1dc,"(isConst)","isConst");
    if (!bVar2) goto LAB_008ae1a5;
    *puVar5 = 0;
  }
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  if ((this->allowLexicalThis != false) ||
     ((bVar3 = 0, propertyId != 0x2d5 && (propertyId != 0x2d8)))) {
    bVar3 = 0;
    if ((0xf < (uint)propertyId) &&
       ((propertyId & 0xfffffffeU) != 0x2d6 || this->allowSuperReference != false)) {
      pDVar7 = this->pFrame;
      if (pDVar7 == (DiagStackFrame *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x1f1,"(pFrame)","pFrame");
        if (!bVar2) {
LAB_008ae1a5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        pDVar7 = this->pFrame;
      }
      iVar4 = (*pDVar7->_vptr_DiagStackFrame[2])();
      this_00 = JavascriptFunction::GetFunctionBody
                          ((JavascriptFunction *)CONCAT44(extraout_var,iVar4));
      if ((this_00 != (FunctionBody *)0x0) &&
         (pSVar6 = FunctionBody::GetScopeObjectChain(this_00), pSVar6 != (ScopeObjectChain *)0x0)) {
        iVar4 = LocalsWalker::GetAdjustedByteCodeOffset(this->pFrame);
        pSVar6 = FunctionBody::GetScopeObjectChain(this_00);
        bVar2 = ScopeObjectChain::TryGetDebuggerScopePropertyInfo
                          (pSVar6,propertyId,location,iVar4,isPropertyInDebuggerScope,isConst,
                           isInDeadZone);
        if (bVar2) {
          return true;
        }
      }
      bVar3 = *isPropertyInDebuggerScope ^ 1;
    }
  }
  return (bool)bVar3;
}

Assistant:

bool VariableWalkerBase::IsPropertyValid(PropertyId propertyId, RegSlot location, bool *isPropertyInDebuggerScope, bool* isConst, bool* isInDeadZone) const
    {
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);
        *isPropertyInDebuggerScope = false;

        // Default to writable (for the case of vars and internal properties).
        *isConst = false;

        if (!allowLexicalThis && (propertyId == Js::PropertyIds::_this || propertyId == Js::PropertyIds::_newTarget))
        {
            return false;
        }

        if (!allowSuperReference && (propertyId == Js::PropertyIds::_super || propertyId == Js::PropertyIds::_superConstructor))
        {
            return false;
        }

        if (Js::IsInternalPropertyId(propertyId))
        {
            return false;
        }

        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody && pFBody->GetScopeObjectChain())
        {
            int offset = GetAdjustedByteCodeOffset();

            if (pFBody->GetScopeObjectChain()->TryGetDebuggerScopePropertyInfo(
                propertyId,
                location,
                offset,
                isPropertyInDebuggerScope,
                isConst,
                isInDeadZone))
            {
                return true;
            }
        }

        // If the register was not found in any scopes, then it's a var and should be in scope.
        return !*isPropertyInDebuggerScope;
    }